

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

TableauPileCollider * __thiscall
solitaire::Context::getTableauPileCollider(Context *this,PileId *id)

{
  bool bVar1;
  runtime_error *this_00;
  uint *puVar2;
  const_reference this_01;
  type pTVar3;
  PileId *id_local;
  Context *this_local;
  
  bVar1 = boost::operators_impl::operator>=(id,&solitaire::interfaces::Solitaire::tableauPilesCount)
  ;
  if (!bVar1) {
    puVar2 = piles::PileId::operator_cast_to_unsigned_int_(id);
    this_01 = std::
              array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
              ::operator[](&this->tableauPileColliders,(ulong)*puVar2);
    pTVar3 = std::
             unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             ::operator*(this_01);
    return pTVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  puVar2 = piles::PileId::operator_cast_to_unsigned_int_(id);
  std::runtime_error::runtime_error(this_00,"Invalid tableau pile id: " + *puVar2);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const TableauPileCollider& Context::getTableauPileCollider(const PileId id) const {
    if (id >= Solitaire::tableauPilesCount)
        throw std::runtime_error {"Invalid tableau pile id: " + id};
    return *tableauPileColliders[id];
}